

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O1

void __thiscall
Memory::SmallHeapBlockT<MediumAllocationBlockAttributes>::EnqueueProcessedObject
          (SmallHeapBlockT<MediumAllocationBlockAttributes> *this,FreeObject **list,
          FreeObject **tail,void *objectAddress,uint index)

{
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  undefined8 *in_FS_OFFSET;
  
  if (*tail == (FreeObject *)0x0) {
    if (*list != (FreeObject *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar1 = (undefined4 *)*in_FS_OFFSET;
      *puVar1 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                         ,0x67b,"(*list == nullptr)","*list == nullptr");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar1 = 0;
    }
    *tail = (FreeObject *)objectAddress;
  }
  EnqueueProcessedObject(this,list,objectAddress,index);
  return;
}

Assistant:

void
SmallHeapBlockT<TBlockAttributes>::EnqueueProcessedObject(FreeObject ** list, FreeObject ** tail, void* objectAddress, uint index)
{
    if (*tail == nullptr)
    {
        Assert(*list == nullptr);
        *tail = (FreeObject *)objectAddress;
    }
    EnqueueProcessedObject(list, objectAddress, index);
}